

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reachability_graph.hh
# Opt level: O1

void __thiscall
tchecker::graph::reachability::
graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
::clear(graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>
        *this)

{
  _Node_const_iterator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_true,_true>
  it;
  _Hash_node_base *p_Var1;
  
  p_Var1 = (this->_find_graph)._nodes._table._M_h._M_before_begin._M_nxt;
  if (p_Var1 != (_Hash_node_base *)0x0) {
    do {
      directed::
      graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
      ::remove_edges((graph_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>
                      *)&this->field_0x50,
                     (intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
                      *)(p_Var1 + 1));
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>::node_sptr_equal_to_t,_tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>::node_sptr_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>_>,_std::__detail::_Identity,_tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>::node_sptr_equal_to_t,_tchecker::graph::reachability::graph_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t,_tchecker::tck_liveness::zg_ndfs::node_hash_t,_tchecker::tck_liveness::zg_ndfs::node_equal_to_t>::node_sptr_hash_t,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&this->_find_graph);
  pool_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::destruct_all(&(this->_node_pool)._node_pool);
  pool_t<tchecker::make_shared_t<tchecker::graph::reachability::edge_t<tchecker::tck_liveness::zg_ndfs::node_t,_tchecker::tck_liveness::zg_ndfs::edge_t>,_unsigned_long,_1UL>_>
  ::destruct_all(&(this->_edge_pool)._edge_pool);
  return;
}

Assistant:

void clear()
  {
    _directed_graph.clear(_find_graph.begin(), _find_graph.end());
    _find_graph.clear();
    _node_pool.destruct_all();
    _edge_pool.destruct_all();
  }